

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O1

bool __thiscall
deqp::UniformBlockCase::checkLayoutIndices(UniformBlockCase *this,UniformLayout *layout)

{
  ostringstream *poVar1;
  int iVar2;
  TestLog *pTVar3;
  pointer pUVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  pointer pBVar10;
  uint local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  uVar6 = (uint)((ulong)((long)(layout->uniforms).
                               super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(layout->uniforms).
                              super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 6);
  local_1c0 = (uint)((ulong)((long)(layout->blocks).
                                   super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(layout->blocks).
                                  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 6);
  if ((int)uVar6 < 1) {
    bVar5 = true;
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    uVar9 = (ulong)(uVar6 & 0x7fffffff);
    bVar5 = true;
    lVar7 = 0;
    do {
      pUVar4 = (layout->uniforms).
               super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar2 = *(int *)((long)&pUVar4->blockNdx + lVar7);
      if ((iVar2 < 0) || ((int)local_1c0 <= iVar2)) {
        local_1b0._0_8_ = pTVar3;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Error: Invalid block index in uniform \'",0x27);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,*(char **)((long)&(pUVar4->name)._M_dataplus._M_p + lVar7),
                   *(long *)((long)&(pUVar4->name)._M_string_length + lVar7));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\'",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar5 = false;
      }
      lVar7 = lVar7 + 0x40;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  if (0 < (int)local_1c0) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    uVar9 = 0;
    do {
      pBVar10 = (layout->blocks).
                super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar8 = *(int **)&pBVar10[uVar9].activeUniformIndices.
                         super__Vector_base<int,_std::allocator<int>_>;
      if (piVar8 != *(pointer *)
                     ((long)&pBVar10[uVar9].activeUniformIndices.
                             super__Vector_base<int,_std::allocator<int>_> + 8)) {
        pBVar10 = pBVar10 + uVar9;
        do {
          if ((*piVar8 < 0) || ((int)uVar6 <= *piVar8)) {
            local_1b0._0_8_ = pTVar3;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Error: Invalid active uniform index ",0x24);
            std::ostream::operator<<(poVar1,*piVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," in block \'",0xb)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,(pBVar10->name)._M_dataplus._M_p,
                       (pBVar10->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\'",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            bVar5 = false;
          }
          piVar8 = piVar8 + 1;
        } while (piVar8 != *(pointer *)
                            ((long)&(pBVar10->activeUniformIndices).
                                    super__Vector_base<int,_std::allocator<int>_> + 8));
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (local_1c0 & 0x7fffffff));
  }
  return bVar5;
}

Assistant:

bool UniformBlockCase::checkLayoutIndices(const UniformLayout& layout) const
{
	TestLog& log		 = m_testCtx.getLog();
	int		 numUniforms = (int)layout.uniforms.size();
	int		 numBlocks   = (int)layout.blocks.size();
	bool	 isOk		 = true;

	// Check uniform block indices.
	for (int uniformNdx = 0; uniformNdx < numUniforms; uniformNdx++)
	{
		const UniformLayoutEntry& uniform = layout.uniforms[uniformNdx];

		if (uniform.blockNdx < 0 || !deInBounds32(uniform.blockNdx, 0, numBlocks))
		{
			log << TestLog::Message << "Error: Invalid block index in uniform '" << uniform.name << "'"
				<< TestLog::EndMessage;
			isOk = false;
		}
	}

	// Check active uniforms.
	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const BlockLayoutEntry& block = layout.blocks[blockNdx];

		for (vector<int>::const_iterator uniformIter = block.activeUniformIndices.begin();
			 uniformIter != block.activeUniformIndices.end(); uniformIter++)
		{
			if (!deInBounds32(*uniformIter, 0, numUniforms))
			{
				log << TestLog::Message << "Error: Invalid active uniform index " << *uniformIter << " in block '"
					<< block.name << "'" << TestLog::EndMessage;
				isOk = false;
			}
		}
	}

	return isOk;
}